

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O2

void write2_cb(uv_write_t *req,int status)

{
  int64_t eval_b;
  int64_t eval_a;
  
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
            ,0x121,"status","==","0",(long)status,"==",0);
    abort();
  }
  write2_cb_called = write2_cb_called + 1;
  if ((write2_cb_called == 2) && (is_in_process != 0)) {
    uv_close(&ctx2.recv.handle,(uv_close_cb)0x0);
    uv_close(&ctx2.recv2.handle,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&ctx2.channel,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&ctx2,(uv_close_cb)0x0);
    return;
  }
  return;
}

Assistant:

static void write2_cb(uv_write_t* req, int status) {
  ASSERT_OK(status);

  /* After two successful writes in the child process, allow the child
   * process to be closed. */
  if (++write2_cb_called == 2 && (is_child_process || is_in_process)) {
    uv_close(&ctx2.recv.handle, NULL);
    uv_close(&ctx2.recv2.handle, NULL);
    uv_close((uv_handle_t*)&ctx2.channel, NULL);
    uv_close((uv_handle_t*)&ctx2.listen, NULL);
  }
}